

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

FindInfo __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
::find_first_non_full
          (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
           *this,size_t hash)

{
  ctrl_t *pcVar1;
  FindInfo FVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  int __c;
  int __c_00;
  char *pcVar6;
  BitMask<unsigned_int,_16,_0> local_5c;
  undefined1 local_58 [4];
  BitMask<unsigned_int,_16,_0> mask;
  Group g;
  undefined1 local_40 [8];
  probe_seq<16UL> seq;
  size_t hash_local;
  raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
  *this_local;
  
  seq.index_ = hash;
  probe((probe_seq<16UL> *)local_40,this,hash);
  while( true ) {
    pcVar1 = this->ctrl_;
    sVar5 = probe_seq<16UL>::offset((probe_seq<16UL> *)local_40);
    pcVar6 = pcVar1 + sVar5;
    GroupSse2Impl::GroupSse2Impl((GroupSse2Impl *)local_58,pcVar6);
    local_5c = GroupSse2Impl::MatchEmptyOrDeleted((GroupSse2Impl *)local_58);
    bVar3 = BitMask::operator_cast_to_bool((BitMask *)&local_5c);
    if (bVar3) {
      iVar4 = BitMask<unsigned_int,_16,_0>::LowestBitSet(&local_5c);
      pcVar6 = (char *)(long)iVar4;
      sVar5 = probe_seq<16UL>::offset((probe_seq<16UL> *)local_40,(size_t)pcVar6);
      pcVar6 = probe_seq<16UL>::index((probe_seq<16UL> *)local_40,pcVar6,__c_00);
      FVar2.probe_length = (size_t)pcVar6;
      FVar2.offset = sVar5;
      return FVar2;
    }
    pcVar6 = probe_seq<16UL>::index((probe_seq<16UL> *)local_40,pcVar6,__c);
    if ((char *)this->capacity_ <= pcVar6) break;
    probe_seq<16UL>::next((probe_seq<16UL> *)local_40);
  }
  __assert_fail("seq.index() < capacity_ && \"full table!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x7bd,
                "FindInfo phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void *, VectorClock<>>, phmap::container_internal::HashEq<void *>::Hash, phmap::container_internal::HashEq<void *>::Eq, std::allocator<std::pair<void *const, VectorClock<>>>>::find_first_non_full(size_t) [Policy = phmap::container_internal::FlatHashMapPolicy<void *, VectorClock<>>, Hash = phmap::container_internal::HashEq<void *>::Hash, Eq = phmap::container_internal::HashEq<void *>::Eq, Alloc = std::allocator<std::pair<void *const, VectorClock<>>>]"
               );
}

Assistant:

FindInfo find_first_non_full(size_t hash) {
        auto seq = probe(hash);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            auto mask = g.MatchEmptyOrDeleted();
            if (mask) {
                return {seq.offset(mask.LowestBitSet()), seq.index()};
            }
            assert(seq.index() < capacity_ && "full table!");
            seq.next();
        }
    }